

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

Duration * __thiscall absl::Duration::operator-=(Duration *this,Duration rhs)

{
  long lVar1;
  uint uVar2;
  int64_t iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = rhs.rep_hi_;
  uVar2 = this->rep_lo_;
  if (uVar2 == 0xffffffff) {
    return this;
  }
  uVar4 = rhs.rep_lo_;
  if (uVar4 == 0xffffffff) {
    iVar3 = -0x8000000000000000;
    if (lVar5 < 0) {
      iVar3 = 0x7fffffffffffffff;
    }
  }
  else {
    lVar1 = this->rep_hi_;
    lVar6 = lVar1 - lVar5;
    this->rep_hi_ = lVar6;
    if (uVar2 < uVar4) {
      lVar6 = lVar6 + -1;
      this->rep_hi_ = lVar6;
      uVar2 = uVar2 + 4000000000;
    }
    this->rep_lo_ = uVar2 - uVar4;
    if (lVar5 < 0) {
      if (lVar1 <= lVar6) {
        return this;
      }
      iVar3 = 0x7fffffffffffffff;
    }
    else {
      if (lVar6 <= lVar1) {
        return this;
      }
      iVar3 = -0x8000000000000000;
    }
  }
  this->rep_hi_ = iVar3;
  this->rep_lo_ = 0xffffffff;
  return this;
}

Assistant:

Duration& Duration::operator-=(Duration rhs) {
  if (time_internal::IsInfiniteDuration(*this)) return *this;
  if (time_internal::IsInfiniteDuration(rhs)) {
    return *this = rhs.rep_hi_ >= 0 ? -InfiniteDuration() : InfiniteDuration();
  }
  const int64_t orig_rep_hi = rep_hi_;
  rep_hi_ =
      DecodeTwosComp(EncodeTwosComp(rep_hi_) - EncodeTwosComp(rhs.rep_hi_));
  if (rep_lo_ < rhs.rep_lo_) {
    rep_hi_ = DecodeTwosComp(EncodeTwosComp(rep_hi_) - 1);
    rep_lo_ += kTicksPerSecond;
  }
  rep_lo_ -= rhs.rep_lo_;
  if (rhs.rep_hi_ < 0 ? rep_hi_ < orig_rep_hi : rep_hi_ > orig_rep_hi) {
    return *this = rhs.rep_hi_ >= 0 ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this;
}